

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

LY_ERR xpath_substring_after
                 (lyxp_set **args,uint32_t UNUSED_arg_count,lyxp_set *set,uint32_t options)

{
  int iVar1;
  lyxp_set *plVar2;
  ly_bool lVar3;
  LY_ERR ret___1;
  LY_ERR LVar4;
  size_t sVar5;
  size_t sVar6;
  char *pcVar7;
  uint32_t uVar8;
  uint uVar9;
  char *pcVar10;
  long lVar11;
  LY_ERR ret__;
  undefined4 uVar12;
  ly_ctx *plVar13;
  ushort *puVar14;
  
  plVar2 = *args;
  if ((options & 0x1c) == 0) {
    LVar4 = lyxp_set_cast(plVar2,LYXP_SET_STRING);
    if (LVar4 != LY_SUCCESS) {
      return LVar4;
    }
    LVar4 = lyxp_set_cast(args[1],LYXP_SET_STRING);
    if (LVar4 == LY_SUCCESS) {
      pcVar7 = (args[1]->val).str;
      pcVar10 = strstr(((*args)->val).str,pcVar7);
      if (pcVar10 != (char *)0x0) {
        sVar5 = strlen(pcVar7);
        sVar6 = strlen(pcVar10 + sVar5);
        set_fill_string(set,pcVar10 + sVar5,(uint32_t)sVar6);
        return LY_SUCCESS;
      }
      set_fill_string(set,"",0);
      return LY_SUCCESS;
    }
    return LVar4;
  }
  if (plVar2->type == LYXP_SET_SCNODE_SET) {
    uVar8 = plVar2->used;
    puVar14 = (ushort *)0x0;
    do {
      uVar8 = uVar8 - 1;
      if (*(int *)((long)(plVar2->val).nodes + (ulong)uVar8 * 0x18 + 0xc) == 2) {
        puVar14 = *(ushort **)((long)(plVar2->val).nodes + (ulong)uVar8 * 0x18);
        break;
      }
    } while (uVar8 != 0);
    if (puVar14 != (ushort *)0x0) {
      if ((*puVar14 & 0xc) == 0) {
        plVar13 = set->ctx;
        pcVar7 = lys_nodetype2str(*puVar14);
        pcVar10 = "Argument #1 of %s is a %s node \"%s\".";
      }
      else {
        lVar3 = warn_is_string_type(*(lysc_type **)(puVar14 + 0x30));
        if (lVar3 != '\0') goto LAB_001b7d66;
        plVar13 = set->ctx;
        pcVar7 = *(char **)(puVar14 + 0x14);
        pcVar10 = "Argument #1 of %s is node \"%s\", not of string-type.";
      }
      ly_log(plVar13,LY_LLWRN,LY_SUCCESS,pcVar10,"xpath_substring_after",pcVar7);
    }
  }
LAB_001b7d66:
  plVar2 = args[1];
  if (plVar2->type == LYXP_SET_SCNODE_SET) {
    uVar9 = plVar2->used;
    puVar14 = (ushort *)0x0;
    do {
      uVar9 = uVar9 - 1;
      if (*(int *)((long)(plVar2->val).nodes + (ulong)uVar9 * 0x18 + 0xc) == 2) {
        puVar14 = *(ushort **)((long)(plVar2->val).nodes + (ulong)uVar9 * 0x18);
        break;
      }
    } while (uVar9 != 0);
    if (puVar14 != (ushort *)0x0) {
      if ((*puVar14 & 0xc) == 0) {
        plVar13 = set->ctx;
        pcVar7 = lys_nodetype2str(*puVar14);
        pcVar10 = "Argument #2 of %s is a %s node \"%s\".";
      }
      else {
        lVar3 = warn_is_string_type(*(lysc_type **)(puVar14 + 0x30));
        if (lVar3 != '\0') goto LAB_001b7e09;
        plVar13 = set->ctx;
        pcVar7 = *(char **)(puVar14 + 0x14);
        pcVar10 = "Argument #2 of %s is node \"%s\", not of string-type.";
      }
      ly_log(plVar13,LY_LLWRN,LY_SUCCESS,pcVar10,"xpath_substring_after",pcVar7);
    }
  }
LAB_001b7e09:
  uVar9 = set->used;
  if ((ulong)uVar9 != 0) {
    lVar11 = 0;
    do {
      iVar1 = *(int *)((long)&((set->val).nodes)->pos + lVar11);
      if (iVar1 == 2) {
        uVar12 = 1;
LAB_001b7e39:
        *(undefined4 *)((long)&((set->val).nodes)->pos + lVar11) = uVar12;
      }
      else if (iVar1 == -2) {
        uVar12 = 0xffffffff;
        goto LAB_001b7e39;
      }
      lVar11 = lVar11 + 0x18;
    } while ((ulong)uVar9 * 0x18 != lVar11);
  }
  return LY_SUCCESS;
}

Assistant:

static LY_ERR
xpath_substring_after(struct lyxp_set **args, uint32_t UNUSED(arg_count), struct lyxp_set *set, uint32_t options)
{
    char *ptr;
    struct lysc_node_leaf *sleaf;
    LY_ERR rc = LY_SUCCESS;

    if (options & LYXP_SCNODE_ALL) {
        if ((args[0]->type == LYXP_SET_SCNODE_SET) && (sleaf = (struct lysc_node_leaf *)warn_get_scnode_in_ctx(args[0]))) {
            if (!(sleaf->nodetype & (LYS_LEAF | LYS_LEAFLIST))) {
                LOGWRN(set->ctx, "Argument #1 of %s is a %s node \"%s\".", __func__, lys_nodetype2str(sleaf->nodetype), sleaf->name);
            } else if (!warn_is_string_type(sleaf->type)) {
                LOGWRN(set->ctx, "Argument #1 of %s is node \"%s\", not of string-type.", __func__, sleaf->name);
            }
        }

        if ((args[1]->type == LYXP_SET_SCNODE_SET) && (sleaf = (struct lysc_node_leaf *)warn_get_scnode_in_ctx(args[1]))) {
            if (!(sleaf->nodetype & (LYS_LEAF | LYS_LEAFLIST))) {
                LOGWRN(set->ctx, "Argument #2 of %s is a %s node \"%s\".", __func__, lys_nodetype2str(sleaf->nodetype), sleaf->name);
            } else if (!warn_is_string_type(sleaf->type)) {
                LOGWRN(set->ctx, "Argument #2 of %s is node \"%s\", not of string-type.", __func__, sleaf->name);
            }
        }
        set_scnode_clear_ctx(set, LYXP_SET_SCNODE_ATOM_VAL);
        return rc;
    }

    rc = lyxp_set_cast(args[0], LYXP_SET_STRING);
    LY_CHECK_RET(rc);
    rc = lyxp_set_cast(args[1], LYXP_SET_STRING);
    LY_CHECK_RET(rc);

    ptr = strstr(args[0]->val.str, args[1]->val.str);
    if (ptr) {
        set_fill_string(set, ptr + strlen(args[1]->val.str), strlen(ptr + strlen(args[1]->val.str)));
    } else {
        set_fill_string(set, "", 0);
    }

    return LY_SUCCESS;
}